

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

UBool __thiscall
icu_63::NumeratorSubstitution::doParse
          (NumeratorSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double upperBound,UBool param_5,uint32_t nonNumericalExecutedRuleMask,
          Formattable *result)

{
  char16_t cVar1;
  undefined4 uVar2;
  int32_t iVar3;
  long lVar4;
  int iVar5;
  double baseValue_00;
  ParsePosition workPos;
  UErrorCode status;
  double local_100;
  Formattable *local_f8;
  UnicodeString *local_f0;
  double local_e8;
  UnicodeString workText;
  Formattable temp;
  
  status = U_ZERO_ERROR;
  local_100 = baseValue;
  local_e8 = upperBound;
  UnicodeString::UnicodeString(&workText,text);
  if (this->withZeros == '\0') {
    iVar5 = 0;
    baseValue_00 = local_100;
  }
  else {
    workPos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003a03b0;
    workPos.index = 1;
    workPos.errorIndex = -1;
    local_f8 = result;
    local_f0 = text;
    Formattable::Formattable(&temp);
    iVar5 = 0;
    while( true ) {
      uVar2 = workText.fUnion.fFields.fLength;
      if (-1 < workText.fUnion.fStackFields.fLengthAndFlags) {
        uVar2 = (int)workText.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (((int)uVar2 < 1) || (workPos.index == 0)) break;
      workPos._8_8_ = workPos._8_8_ & 0xffffffff00000000;
      NFRuleSet::parse((this->super_NFSubstitution).ruleSet,&workText,&workPos,1.0,
                       nonNumericalExecutedRuleMask,&temp);
      if (workPos.index == 0) break;
      parsePosition->index = parsePosition->index + workPos.index;
      UnicodeString::remove(&workText,(char *)0x0);
      iVar5 = iVar5 + 1;
      while( true ) {
        uVar2 = workText.fUnion.fFields.fLength;
        if (-1 < workText.fUnion.fStackFields.fLengthAndFlags) {
          uVar2 = (int)workText.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (((int)uVar2 < 1) || (cVar1 = UnicodeString::doCharAt(&workText,0), cVar1 != L' '))
        break;
        UnicodeString::remove(&workText,(char *)0x0);
        parsePosition->index = parsePosition->index + 1;
      }
    }
    UnicodeString::operator=(&workText,local_f0);
    UnicodeString::remove(&workText,(char *)0x0);
    parsePosition->index = 0;
    Formattable::~Formattable(&temp);
    ParsePosition::~ParsePosition(&workPos);
    result = local_f8;
    baseValue_00 = local_100;
    if (this->withZeros != '\0') {
      baseValue_00 = 1.0;
    }
  }
  NFSubstitution::doParse
            (&this->super_NFSubstitution,&workText,parsePosition,baseValue_00,local_e8,'\0',
             nonNumericalExecutedRuleMask,result);
  if (this->withZeros != '\0') {
    iVar3 = Formattable::getLong(result,&status);
    for (lVar4 = 1; lVar4 <= iVar3; lVar4 = lVar4 * 10) {
    }
    for (; 0 < iVar5; iVar5 = iVar5 + -1) {
      lVar4 = lVar4 * 10;
    }
    Formattable::setDouble(result,(double)iVar3 / (double)lVar4);
  }
  UnicodeString::~UnicodeString(&workText);
  return '\x01';
}

Assistant:

UBool 
NumeratorSubstitution::doParse(const UnicodeString& text, 
                               ParsePosition& parsePosition,
                               double baseValue,
                               double upperBound,
                               UBool /*lenientParse*/,
                               uint32_t nonNumericalExecutedRuleMask,
                               Formattable& result) const
{
    // we don't have to do anything special to do the parsing here,
    // but we have to turn lenient parsing off-- if we leave it on,
    // it SERIOUSLY messes up the algorithm

    // if withZeros is true, we need to count the zeros
    // and use that to adjust the parse result
    UErrorCode status = U_ZERO_ERROR;
    int32_t zeroCount = 0;
    UnicodeString workText(text);

    if (withZeros) {
        ParsePosition workPos(1);
        Formattable temp;

        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            getRuleSet()->parse(workText, workPos, 1, nonNumericalExecutedRuleMask, temp); // parse zero or nothing at all
            if (workPos.getIndex() == 0) {
                // we failed, either there were no more zeros, or the number was formatted with digits
                // either way, we're done
                break;
            }

            ++zeroCount;
            parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
            workText.remove(0, workPos.getIndex());
            while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                workText.remove(0, 1);
                parsePosition.setIndex(parsePosition.getIndex() + 1);
            }
        }

        workText = text;
        workText.remove(0, (int32_t)parsePosition.getIndex());
        parsePosition.setIndex(0);
    }

    // we've parsed off the zeros, now let's parse the rest from our current position
    NFSubstitution::doParse(workText, parsePosition, withZeros ? 1 : baseValue, upperBound, FALSE, nonNumericalExecutedRuleMask, result);

    if (withZeros) {
        // any base value will do in this case.  is there a way to
        // force this to not bother trying all the base values?

        // compute the 'effective' base and prescale the value down
        int64_t n = result.getLong(status); // force conversion!
        int64_t d = 1;
        int32_t pow = 0;
        while (d <= n) {
            d *= 10;
            ++pow;
        }
        // now add the zeros
        while (zeroCount > 0) {
            d *= 10;
            --zeroCount;
        }
        // d is now our true denominator
        result.setDouble((double)n/(double)d);
    }

    return TRUE;
}